

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  BYTE *iEnd;
  BYTE *iStart;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  uint uVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  U32 UVar13;
  BYTE *pBVar14;
  size_t sVar15;
  ulong uVar16;
  BYTE *pBVar17;
  uint uVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  int *piVar21;
  int iVar22;
  int iVar23;
  int *ip;
  int *piVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  bool bVar28;
  int *local_130;
  ulong local_120;
  uint local_f4;
  uint local_d4;
  int *local_d0;
  
  iEnd = (BYTE *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  pBVar4 = (ms->window).base;
  pBVar5 = (ms->window).dictBase;
  uVar2 = (ms->window).dictLimit;
  uVar3 = (ms->window).lowLimit;
  pBVar14 = pBVar5 + uVar2;
  local_f4 = *rep;
  local_d4 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  iStart = pBVar4 + uVar2;
  ip = (int *)((ulong)(iStart == (BYTE *)src) + (long)src);
  iVar9 = uVar2 - 1;
LAB_00155354:
  do {
    if (piVar1 <= ip) {
      *rep = local_f4;
      rep[1] = local_d4;
      return (long)iEnd - (long)src;
    }
    iVar23 = (int)ip;
    iVar22 = iVar23 - (int)pBVar4;
    uVar10 = (iVar22 - local_f4) + 1;
    pBVar17 = pBVar4;
    if (uVar10 < uVar2) {
      pBVar17 = pBVar5;
    }
    if ((uVar3 < uVar10 && 2 < iVar9 - uVar10) &&
       (*(int *)((long)ip + 1) == *(int *)(pBVar17 + uVar10))) {
      pBVar19 = iEnd;
      if (uVar10 < uVar2) {
        pBVar19 = pBVar14;
      }
      sVar15 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar17 + uVar10) + 4),iEnd,pBVar19
                          ,iStart);
      local_d0 = (int *)(sVar15 + 4);
    }
    else {
      local_d0 = (int *)0x0;
    }
    if (cParams->searchLength - 6 < 2) {
      pUVar6 = ms->chainTable;
      uVar11 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar17 = (ms->window).base;
      pBVar19 = (ms->window).dictBase;
      uVar10 = (ms->window).dictLimit;
      uVar18 = (ms->window).lowLimit;
      uVar26 = iVar23 - (int)pBVar17;
      uVar7 = uVar26 - uVar11;
      if (uVar26 < uVar11) {
        uVar7 = 0;
      }
      iVar23 = 1 << ((byte)cParams->searchLog & 0x1f);
      uVar12 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
      local_120 = 99999999;
      uVar25 = 3;
      while( true ) {
        bVar28 = iVar23 == 0;
        iVar23 = iVar23 + -1;
        if ((uVar12 <= uVar18) || (bVar28)) break;
        if (uVar12 < uVar10) {
          if (*(int *)(pBVar19 + uVar12) == *ip) {
            sVar15 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),pBVar19 + (ulong)uVar12 + 4,iEnd,pBVar19 + uVar10,
                                pBVar17 + uVar10);
            uVar16 = sVar15 + 4;
LAB_00155528:
            if ((uVar25 < uVar16) &&
               (local_120 = (ulong)((uVar26 + 2) - uVar12), uVar25 = uVar16,
               (BYTE *)((long)ip + uVar16) == iEnd)) break;
          }
        }
        else if ((pBVar17 + uVar12)[uVar25] == *(BYTE *)((long)ip + uVar25)) {
          uVar16 = ZSTD_count((BYTE *)ip,pBVar17 + uVar12,iEnd);
          goto LAB_00155528;
        }
        if (uVar12 <= uVar7) break;
        uVar12 = pUVar6[uVar12 & uVar11 - 1];
      }
    }
    else if (cParams->searchLength == 5) {
      pUVar6 = ms->chainTable;
      uVar11 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar17 = (ms->window).base;
      pBVar19 = (ms->window).dictBase;
      uVar10 = (ms->window).dictLimit;
      uVar18 = (ms->window).lowLimit;
      uVar26 = iVar23 - (int)pBVar17;
      uVar7 = uVar26 - uVar11;
      if (uVar26 < uVar11) {
        uVar7 = 0;
      }
      iVar23 = 1 << ((byte)cParams->searchLog & 0x1f);
      uVar12 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
      local_120 = 99999999;
      uVar25 = 3;
      while( true ) {
        bVar28 = iVar23 == 0;
        iVar23 = iVar23 + -1;
        if ((uVar12 <= uVar18) || (bVar28)) break;
        if (uVar12 < uVar10) {
          if (*(int *)(pBVar19 + uVar12) == *ip) {
            sVar15 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),pBVar19 + (ulong)uVar12 + 4,iEnd,pBVar19 + uVar10,
                                pBVar17 + uVar10);
            uVar16 = sVar15 + 4;
LAB_00155683:
            if ((uVar25 < uVar16) &&
               (local_120 = (ulong)((uVar26 + 2) - uVar12), uVar25 = uVar16,
               (BYTE *)((long)ip + uVar16) == iEnd)) break;
          }
        }
        else if ((pBVar17 + uVar12)[uVar25] == *(BYTE *)((long)ip + uVar25)) {
          uVar16 = ZSTD_count((BYTE *)ip,pBVar17 + uVar12,iEnd);
          goto LAB_00155683;
        }
        if (uVar12 <= uVar7) break;
        uVar12 = pUVar6[uVar12 & uVar11 - 1];
      }
    }
    else {
      pUVar6 = ms->chainTable;
      uVar11 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar17 = (ms->window).base;
      pBVar19 = (ms->window).dictBase;
      uVar10 = (ms->window).dictLimit;
      uVar18 = (ms->window).lowLimit;
      uVar26 = iVar23 - (int)pBVar17;
      uVar7 = uVar26 - uVar11;
      if (uVar26 < uVar11) {
        uVar7 = 0;
      }
      iVar23 = 1 << ((byte)cParams->searchLog & 0x1f);
      uVar12 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
      local_120 = 99999999;
      uVar25 = 3;
      while( true ) {
        bVar28 = iVar23 == 0;
        iVar23 = iVar23 + -1;
        if ((uVar12 <= uVar18) || (bVar28)) break;
        if (uVar12 < uVar10) {
          if (*(int *)(pBVar19 + uVar12) == *ip) {
            sVar15 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),pBVar19 + (ulong)uVar12 + 4,iEnd,pBVar19 + uVar10,
                                pBVar17 + uVar10);
            uVar16 = sVar15 + 4;
LAB_001557d4:
            if ((uVar25 < uVar16) &&
               (local_120 = (ulong)((uVar26 + 2) - uVar12), uVar25 = uVar16,
               (BYTE *)((long)ip + uVar16) == iEnd)) break;
          }
        }
        else if ((pBVar17 + uVar12)[uVar25] == *(BYTE *)((long)ip + uVar25)) {
          uVar16 = ZSTD_count((BYTE *)ip,pBVar17 + uVar12,iEnd);
          goto LAB_001557d4;
        }
        if (uVar12 <= uVar7) break;
        uVar12 = pUVar6[uVar12 & uVar11 - 1];
      }
    }
    piVar21 = local_d0;
    if (local_d0 < uVar25) {
      piVar21 = (int *)uVar25;
    }
    if (piVar21 < 4) {
      ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
      goto LAB_00155354;
    }
    piVar8 = ip;
    if (uVar25 <= local_d0) {
      local_120 = 0;
      piVar8 = (int *)((long)ip + 1);
    }
LAB_0015586e:
    do {
      iVar23 = iVar22;
      local_130 = piVar8;
      uVar16 = local_120;
      piVar24 = ip;
      uVar25 = (ulong)piVar21;
      if (piVar1 <= piVar24) {
        local_d0 = local_130;
        break;
      }
      ip = (int *)((long)piVar24 + 1);
      iVar22 = iVar23 + 1;
      if (uVar16 == 0) {
        uVar16 = 0;
      }
      else {
        uVar10 = iVar22 - local_f4;
        pBVar17 = pBVar4;
        if (uVar10 < uVar2) {
          pBVar17 = pBVar5;
        }
        if ((uVar3 < uVar10 && 2 < iVar9 - uVar10) && (*ip == *(int *)(pBVar17 + uVar10))) {
          pBVar19 = iEnd;
          if (uVar10 < uVar2) {
            pBVar19 = pBVar14;
          }
          sVar15 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar24 + 5),(BYTE *)((long)(pBVar17 + uVar10) + 4),
                              iEnd,pBVar19,iStart);
          if (sVar15 < 0xfffffffffffffffc) {
            uVar18 = (int)uVar16 + 1;
            uVar10 = 0x1f;
            if (uVar18 != 0) {
              for (; uVar18 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            if ((int)((uVar10 ^ 0x1f) + (int)uVar25 * 3 + -0x1e) < (int)(sVar15 + 4) * 3) {
              uVar16 = 0;
              uVar25 = sVar15 + 4;
              local_130 = ip;
            }
          }
        }
      }
      iVar27 = (int)ip;
      if (cParams->searchLength - 6 < 2) {
        pUVar6 = ms->chainTable;
        uVar11 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar17 = (ms->window).base;
        pBVar19 = (ms->window).dictBase;
        uVar10 = (ms->window).dictLimit;
        uVar18 = (ms->window).lowLimit;
        uVar26 = iVar27 - (int)pBVar17;
        uVar7 = uVar26 - uVar11;
        if (uVar26 < uVar11) {
          uVar7 = 0;
        }
        iVar27 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar13 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
        local_120 = 99999999;
        piVar21 = (int *)0x3;
        while( true ) {
          bVar28 = iVar27 == 0;
          iVar27 = iVar27 + -1;
          if ((UVar13 <= uVar18) || (bVar28)) break;
          if (UVar13 < uVar10) {
            if (*(int *)(pBVar19 + UVar13) == *ip) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar24 + 5),pBVar19 + (ulong)UVar13 + 4,iEnd,
                                  pBVar19 + uVar10,pBVar17 + uVar10);
              sVar15 = sVar15 + 4;
LAB_00155ab2:
              if ((piVar21 < sVar15) &&
                 (local_120 = (ulong)((uVar26 + 2) - UVar13), piVar21 = (int *)sVar15,
                 (BYTE *)((long)ip + sVar15) == iEnd)) break;
            }
          }
          else if ((pBVar17 + UVar13)[(long)piVar21] == *(BYTE *)((long)ip + (long)piVar21)) {
            sVar15 = ZSTD_count((BYTE *)ip,pBVar17 + UVar13,iEnd);
            goto LAB_00155ab2;
          }
          if (UVar13 <= uVar7) break;
          UVar13 = pUVar6[UVar13 & uVar11 - 1];
        }
      }
      else if (cParams->searchLength == 5) {
        pUVar6 = ms->chainTable;
        uVar11 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar17 = (ms->window).base;
        pBVar19 = (ms->window).dictBase;
        uVar10 = (ms->window).dictLimit;
        uVar18 = (ms->window).lowLimit;
        uVar26 = iVar27 - (int)pBVar17;
        uVar7 = uVar26 - uVar11;
        if (uVar26 < uVar11) {
          uVar7 = 0;
        }
        iVar27 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar13 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
        local_120 = 99999999;
        piVar21 = (int *)0x3;
        while( true ) {
          bVar28 = iVar27 == 0;
          iVar27 = iVar27 + -1;
          if ((UVar13 <= uVar18) || (bVar28)) break;
          if (UVar13 < uVar10) {
            if (*(int *)(pBVar19 + UVar13) == *ip) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar24 + 5),pBVar19 + (ulong)UVar13 + 4,iEnd,
                                  pBVar19 + uVar10,pBVar17 + uVar10);
              sVar15 = sVar15 + 4;
LAB_00155c25:
              if ((piVar21 < sVar15) &&
                 (local_120 = (ulong)((uVar26 + 2) - UVar13), piVar21 = (int *)sVar15,
                 (BYTE *)((long)ip + sVar15) == iEnd)) break;
            }
          }
          else if ((pBVar17 + UVar13)[(long)piVar21] == *(BYTE *)((long)ip + (long)piVar21)) {
            sVar15 = ZSTD_count((BYTE *)ip,pBVar17 + UVar13,iEnd);
            goto LAB_00155c25;
          }
          if (UVar13 <= uVar7) break;
          UVar13 = pUVar6[UVar13 & uVar11 - 1];
        }
      }
      else {
        pUVar6 = ms->chainTable;
        uVar11 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar17 = (ms->window).base;
        pBVar19 = (ms->window).dictBase;
        uVar10 = (ms->window).dictLimit;
        uVar18 = (ms->window).lowLimit;
        uVar26 = iVar27 - (int)pBVar17;
        uVar7 = uVar26 - uVar11;
        if (uVar26 < uVar11) {
          uVar7 = 0;
        }
        iVar27 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar13 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
        local_120 = 99999999;
        piVar21 = (int *)0x3;
        while( true ) {
          bVar28 = iVar27 == 0;
          iVar27 = iVar27 + -1;
          if ((UVar13 <= uVar18) || (bVar28)) break;
          if (UVar13 < uVar10) {
            if (*(int *)(pBVar19 + UVar13) == *ip) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar24 + 5),pBVar19 + (ulong)UVar13 + 4,iEnd,
                                  pBVar19 + uVar10,pBVar17 + uVar10);
              sVar15 = sVar15 + 4;
LAB_00155d8f:
              if ((piVar21 < sVar15) &&
                 (local_120 = (ulong)((uVar26 + 2) - UVar13), piVar21 = (int *)sVar15,
                 (BYTE *)((long)ip + sVar15) == iEnd)) break;
            }
          }
          else if ((pBVar17 + UVar13)[(long)piVar21] == *(BYTE *)((long)ip + (long)piVar21)) {
            sVar15 = ZSTD_count((BYTE *)ip,pBVar17 + UVar13,iEnd);
            goto LAB_00155d8f;
          }
          if (UVar13 <= uVar7) break;
          UVar13 = pUVar6[UVar13 & uVar11 - 1];
        }
      }
      if (3 < piVar21) {
        uVar18 = (int)uVar16 + 1;
        uVar10 = 0x1f;
        if (uVar18 != 0) {
          for (; uVar18 >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
        }
        uVar18 = (int)local_120 + 1;
        iVar27 = 0x1f;
        if (uVar18 != 0) {
          for (; uVar18 >> iVar27 == 0; iVar27 = iVar27 + -1) {
          }
        }
        piVar8 = ip;
        if ((int)((uVar10 ^ 0x1f) + (int)uVar25 * 4 + -0x1b) < (int)piVar21 * 4 - iVar27)
        goto LAB_0015586e;
      }
      local_d0 = local_130;
      if (piVar1 <= ip) break;
      ip = (int *)((long)piVar24 + 2);
      iVar22 = iVar23 + 2;
      if (uVar16 == 0) {
        uVar16 = 0;
      }
      else {
        uVar10 = iVar22 - local_f4;
        pBVar17 = pBVar4;
        if (uVar10 < uVar2) {
          pBVar17 = pBVar5;
        }
        if ((uVar3 < uVar10 && 2 < iVar9 - uVar10) && (*ip == *(int *)(pBVar17 + uVar10))) {
          pBVar19 = iEnd;
          if (uVar10 < uVar2) {
            pBVar19 = pBVar14;
          }
          sVar15 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar24 + 6),(BYTE *)((long)(pBVar17 + uVar10) + 4),
                              iEnd,pBVar19,iStart);
          if (sVar15 < 0xfffffffffffffffc) {
            uVar18 = (int)uVar16 + 1;
            uVar10 = 0x1f;
            if (uVar18 != 0) {
              for (; uVar18 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            if ((int)((uVar10 ^ 0x1f) + (int)uVar25 * 4 + -0x1e) < (int)(sVar15 + 4) * 4) {
              uVar16 = 0;
              local_130 = ip;
              uVar25 = sVar15 + 4;
            }
          }
        }
      }
      iVar23 = (int)ip;
      if (cParams->searchLength - 6 < 2) {
        pUVar6 = ms->chainTable;
        uVar11 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar17 = (ms->window).base;
        pBVar19 = (ms->window).dictBase;
        uVar10 = (ms->window).dictLimit;
        uVar18 = (ms->window).lowLimit;
        uVar26 = iVar23 - (int)pBVar17;
        uVar7 = uVar26 - uVar11;
        if (uVar26 < uVar11) {
          uVar7 = 0;
        }
        iVar23 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar13 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
        local_120 = 99999999;
        piVar21 = (int *)0x3;
        while( true ) {
          bVar28 = iVar23 == 0;
          iVar23 = iVar23 + -1;
          if ((UVar13 <= uVar18) || (bVar28)) break;
          if (UVar13 < uVar10) {
            if (*(int *)(pBVar19 + UVar13) == *ip) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar24 + 6),pBVar19 + (ulong)UVar13 + 4,iEnd,
                                  pBVar19 + uVar10,pBVar17 + uVar10);
              sVar15 = sVar15 + 4;
LAB_00156035:
              if ((piVar21 < sVar15) &&
                 (local_120 = (ulong)((uVar26 + 2) - UVar13), piVar21 = (int *)sVar15,
                 (BYTE *)((long)ip + sVar15) == iEnd)) break;
            }
          }
          else if ((pBVar17 + UVar13)[(long)piVar21] == *(BYTE *)((long)ip + (long)piVar21)) {
            sVar15 = ZSTD_count((BYTE *)ip,pBVar17 + UVar13,iEnd);
            goto LAB_00156035;
          }
          if (UVar13 <= uVar7) break;
          UVar13 = pUVar6[UVar13 & uVar11 - 1];
        }
      }
      else if (cParams->searchLength == 5) {
        pUVar6 = ms->chainTable;
        uVar11 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar17 = (ms->window).base;
        pBVar19 = (ms->window).dictBase;
        uVar10 = (ms->window).dictLimit;
        uVar18 = (ms->window).lowLimit;
        uVar26 = iVar23 - (int)pBVar17;
        uVar7 = uVar26 - uVar11;
        if (uVar26 < uVar11) {
          uVar7 = 0;
        }
        iVar23 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar13 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
        local_120 = 99999999;
        piVar21 = (int *)0x3;
        while( true ) {
          bVar28 = iVar23 == 0;
          iVar23 = iVar23 + -1;
          if ((UVar13 <= uVar18) || (bVar28)) break;
          if (UVar13 < uVar10) {
            if (*(int *)(pBVar19 + UVar13) == *ip) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar24 + 6),pBVar19 + (ulong)UVar13 + 4,iEnd,
                                  pBVar19 + uVar10,pBVar17 + uVar10);
              sVar15 = sVar15 + 4;
LAB_0015619a:
              if ((piVar21 < sVar15) &&
                 (local_120 = (ulong)((uVar26 + 2) - UVar13), piVar21 = (int *)sVar15,
                 (BYTE *)((long)ip + sVar15) == iEnd)) break;
            }
          }
          else if ((pBVar17 + UVar13)[(long)piVar21] == *(BYTE *)((long)ip + (long)piVar21)) {
            sVar15 = ZSTD_count((BYTE *)ip,pBVar17 + UVar13,iEnd);
            goto LAB_0015619a;
          }
          if (UVar13 <= uVar7) break;
          UVar13 = pUVar6[UVar13 & uVar11 - 1];
        }
      }
      else {
        pUVar6 = ms->chainTable;
        uVar11 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar17 = (ms->window).base;
        pBVar19 = (ms->window).dictBase;
        uVar10 = (ms->window).dictLimit;
        uVar18 = (ms->window).lowLimit;
        uVar26 = iVar23 - (int)pBVar17;
        uVar7 = uVar26 - uVar11;
        if (uVar26 < uVar11) {
          uVar7 = 0;
        }
        iVar23 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar13 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
        local_120 = 99999999;
        piVar21 = (int *)0x3;
        while( true ) {
          bVar28 = iVar23 == 0;
          iVar23 = iVar23 + -1;
          if ((UVar13 <= uVar18) || (bVar28)) break;
          if (UVar13 < uVar10) {
            if (*(int *)(pBVar19 + UVar13) == *ip) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar24 + 6),pBVar19 + (ulong)UVar13 + 4,iEnd,
                                  pBVar19 + uVar10,pBVar17 + uVar10);
              sVar15 = sVar15 + 4;
LAB_001562f6:
              if ((piVar21 < sVar15) &&
                 (local_120 = (ulong)((uVar26 + 2) - UVar13), piVar21 = (int *)sVar15,
                 (BYTE *)((long)ip + sVar15) == iEnd)) break;
            }
          }
          else if ((pBVar17 + UVar13)[(long)piVar21] == *(BYTE *)((long)ip + (long)piVar21)) {
            sVar15 = ZSTD_count((BYTE *)ip,pBVar17 + UVar13,iEnd);
            goto LAB_001562f6;
          }
          if (UVar13 <= uVar7) break;
          UVar13 = pUVar6[UVar13 & uVar11 - 1];
        }
      }
      local_d0 = local_130;
      if (piVar21 < 4) break;
      uVar18 = (int)uVar16 + 1;
      uVar10 = 0x1f;
      if (uVar18 != 0) {
        for (; uVar18 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar18 = (int)local_120 + 1;
      iVar23 = 0x1f;
      if (uVar18 != 0) {
        for (; uVar18 >> iVar23 == 0; iVar23 = iVar23 + -1) {
        }
      }
      piVar8 = ip;
    } while ((int)((uVar10 ^ 0x1f) + (int)uVar25 * 4 + -0x18) < (int)piVar21 * 4 - iVar23);
    UVar13 = (U32)uVar16;
    if (uVar16 == 0) {
      UVar13 = 0;
    }
    else {
      pBVar20 = (BYTE *)((long)local_d0 + (-(long)pBVar4 - uVar16) + 2);
      pBVar19 = iStart;
      pBVar17 = pBVar4;
      if ((uint)pBVar20 < uVar2) {
        pBVar19 = pBVar5 + uVar3;
        pBVar17 = pBVar5;
      }
      pBVar17 = pBVar17 + ((ulong)pBVar20 & 0xffffffff);
      for (; ((src < local_d0 && (pBVar19 < pBVar17)) &&
             (*(BYTE *)((long)local_d0 + -1) == pBVar17[-1]));
          local_d0 = (int *)((long)local_d0 + -1)) {
        pBVar17 = pBVar17 + -1;
        uVar25 = uVar25 + 1;
      }
      local_d4 = local_f4;
      local_f4 = UVar13 - 2;
    }
    ZSTD_storeSeq(seqStore,(long)local_d0 - (long)src,src,UVar13,uVar25 - 3);
    uVar10 = local_d4;
    for (ip = (int *)((long)local_d0 + uVar25); local_d4 = uVar10, src = ip, ip <= piVar1;
        ip = (int *)((long)ip + sVar15 + 4)) {
      uVar10 = (uint)((long)ip - (long)(pBVar4 + local_d4));
      pBVar17 = pBVar4;
      if (uVar10 < uVar2) {
        pBVar17 = pBVar5;
      }
      if (((uVar10 <= uVar3) || (iVar9 - uVar10 < 3)) ||
         (*ip != *(int *)(pBVar17 + ((long)ip - (long)(pBVar4 + local_d4) & 0xffffffff)))) break;
      pBVar19 = iEnd;
      if (uVar10 < uVar2) {
        pBVar19 = pBVar14;
      }
      sVar15 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),
                          (BYTE *)((long)(pBVar17 +
                                         ((long)ip - (long)(pBVar4 + local_d4) & 0xffffffff)) + 4),
                          iEnd,pBVar19,iStart);
      ZSTD_storeSeq(seqStore,0,ip,0,sVar15 + 1);
      uVar10 = local_f4;
      local_f4 = local_d4;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 2);
}